

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void chatra::structureInnerNode
               (IErrorReceiver *errorReceiver,shared_ptr<chatra::StringTable> *sTable,Node *node,
               bool recursive)

{
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *this;
  pointer pbVar1;
  NodeType NVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Node *pNVar5;
  pointer psVar6;
  char cVar7;
  char cVar8;
  Token *pTVar9;
  Token *token;
  size_type sVar10;
  __node_base_ptr p_Var11;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  first;
  long *plVar12;
  __normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
  _Var13;
  size_type sVar14;
  iterator iVar15;
  shared_ptr<chatra::Node> *psVar16;
  uint uVar17;
  uint uVar18;
  undefined7 in_register_00000009;
  _Hash_node_base *p_Var19;
  long lVar20;
  size_type *psVar21;
  ulong uVar22;
  iterator __last;
  int iVar23;
  shared_ptr<chatra::Node> *n;
  pointer psVar24;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  last;
  pointer pbVar25;
  long lVar26;
  _Alloc_hider _Var27;
  bool bVar28;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  first_00;
  undefined1 auVar29 [8];
  iterator iVar30;
  undefined1 auVar31 [8];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_178;
  const_iterator itForward;
  undefined1 local_158 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  pointer local_128 [2];
  size_t local_118;
  size_t tokenIndex;
  ParserContext ct;
  StringId local_e4;
  Token *local_e0;
  undefined1 auStack_d8 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> outNodes;
  string local_b8;
  char *local_98;
  uint local_90;
  char local_88 [24];
  Node *local_70;
  undefined1 local_68 [40];
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_40;
  uint local_34;
  
  ct.sTable._4_4_ = (undefined4)CONCAT71(in_register_00000009,recursive);
  tokenIndex = 0;
  peVar3 = (node->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = peVar3->indents + 1;
  }
  auStack_d8 = (undefined1  [8])0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  first_00._M_current =
       (node->blockNodes).
       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  last._M_current =
       (node->blockNodes).
       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  itForward._M_current = (shared_ptr<chatra::Node> *)errorReceiver;
  ct.ws = (ParserWorkingSet *)errorReceiver;
  ct.errorReceiver = (IErrorReceiver *)sTable;
  local_70 = node;
  if (first_00._M_current != last._M_current) {
    do {
      peVar3 = ((((first_00._M_current)->
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->line).
               super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pTVar9 = (peVar3->tokens).super__Vector_base<chatra::Token,_std::allocator<chatra::Token>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (peVar3->indents == local_34) {
        first._M_current = first_00._M_current;
        if (pTVar9->type == Name) {
          local_118 = 0;
          local_178._M_current = first_00._M_current;
          local_e0 = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                               (first_00,last,&local_178,&local_118);
          pTVar9 = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                             (first_00,(node->blockNodes).
                                       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_178,
                              &local_118);
          token = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                            (first_00,(node->blockNodes).
                                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,&local_178,
                             &local_118);
          local_e4 = Invalid;
          local_40._M_current = first_00._M_current;
          if (token != (Token *)0x0) {
            sVar10 = std::
                     _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::count((_Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)lineTypes,&local_e0->sid);
            if (((sVar10 == 0) && (pTVar9->sid == Colon)) && (token->type == Name)) {
              local_e4 = local_e0->sid;
              local_e0 = token;
            }
          }
          node = local_70;
          p_Var11 = std::
                    _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::_M_find_before_node
                              ((_Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                *)lineTypes,(ulong)local_e0->sid % (ulong)lineTypes._8_8_,
                               &local_e0->sid,(ulong)local_e0->sid);
          if (p_Var11 == (__node_base_ptr)0x0) {
            p_Var19 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var19 = p_Var11->_M_nxt;
          }
          if (p_Var19 == (_Hash_node_base *)0x0) {
            iVar23 = 0;
            first_00._M_current = local_40._M_current;
            first._M_current = local_40._M_current;
          }
          else {
            first = combineWrappedLines<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                              (local_40,(node->blockNodes).
                                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                               *(bool *)((long)&p_Var19[2]._M_nxt + 1));
            if ((token == (Token *)0x0) || (local_e4 == Invalid)) {
LAB_00186bdb:
              _Var13 = std::
                       __find_if<__gnu_cxx::__normal_iterator<chatra::NodeType_const*,std::vector<chatra::NodeType,std::allocator<chatra::NodeType>>>,__gnu_cxx::__ops::_Iter_equals_val<chatra::NodeType_const>>
                                 (p_Var19[3]._M_nxt,p_Var19[4]._M_nxt,node);
              first_00._M_current = local_40._M_current;
              node = local_70;
              if ((_Hash_node_base *)_Var13._M_current != p_Var19[4]._M_nxt) {
                NVar2 = *(NodeType *)&p_Var19[2]._M_nxt;
                peVar4 = ((local_40._M_current)->
                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                peVar4->type = NVar2;
                if (((pTVar9 != (Token *)0x0) && (NVar2 == Def)) && (pTVar9->sid == Operator)) {
                  peVar4->type = DefOperator;
                }
                if (((pTVar9 != (Token *)0x0) && (peVar4->type == Else)) && (pTVar9->sid == If)) {
                  peVar4->type = ElseIf;
                }
                if ((*(char *)((long)&p_Var19[2]._M_nxt + 1) == '\x01') &&
                   (first._M_current !=
                    (local_70->blockNodes).
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)) {
                  do {
                    if ((((((first._M_current)->
                           super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                         line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->indents <= local_34) break;
                    std::
                    vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ::push_back(&(((first_00._M_current)->
                                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr)->blockNodes,first._M_current);
                    first._M_current = first._M_current + 1;
                  } while (first._M_current !=
                           (node->blockNodes).
                           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                }
                iVar23 = 3;
                std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             *)auStack_d8,first_00._M_current);
                goto LAB_00186edf;
              }
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"statement \"","")
              ;
              node = local_70;
              lVar20 = (ulong)local_e0->sid * 0x20;
              local_138._M_allocated_capacity = (size_type)local_128;
              lVar26 = *(long *)((ct.errorReceiver)->_vptr_IErrorReceiver[8] + lVar20);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_138,lVar26,
                         *(long *)((ct.errorReceiver)->_vptr_IErrorReceiver[8] + lVar20 + 8) +
                         lVar26);
              first_00._M_current = local_40._M_current;
              pbVar25 = (pointer)0xf;
              if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
                pbVar25 = (pointer)local_158._16_8_;
              }
              pbVar1 = (pointer)((long)&((_Alloc_hider *)local_158._8_8_)->_M_p + local_138._8_8_);
              if (pbVar25 < pbVar1) {
                pbVar25 = (pointer)0xf;
                if ((pointer *)local_138._M_allocated_capacity != local_128) {
                  pbVar25 = local_128[0];
                }
                if (pbVar25 < pbVar1) goto LAB_00186d4e;
                plVar12 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_138,0,(char *)0x0,local_158._0_8_);
              }
              else {
LAB_00186d4e:
                plVar12 = (long *)std::__cxx11::string::_M_append
                                            (local_158,local_138._M_allocated_capacity);
              }
              local_68._0_8_ = local_68 + 0x10;
              pbVar25 = (pointer)(plVar12 + 2);
              if ((pointer)*plVar12 == pbVar25) {
                local_68._16_8_ = (pbVar25->_M_dataplus)._M_p;
                local_68._24_8_ = plVar12[3];
              }
              else {
                local_68._16_8_ = (pbVar25->_M_dataplus)._M_p;
                local_68._0_8_ = (pointer)*plVar12;
              }
              local_68._8_8_ = plVar12[1];
              *plVar12 = (long)pbVar25;
              plVar12[1] = 0;
              *(undefined1 *)&(pbVar25->_M_dataplus)._M_p = 0;
              plVar12 = (long *)std::__cxx11::string::append(local_68);
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              psVar21 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar21) {
                local_b8.field_2._M_allocated_capacity = *psVar21;
                local_b8.field_2._8_8_ = plVar12[3];
              }
              else {
                local_b8.field_2._M_allocated_capacity = *psVar21;
                local_b8._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_b8._M_string_length = plVar12[1];
              *plVar12 = (long)psVar21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ParserContext::errorAtToken
                        ((ParserContext *)&tokenIndex,Error,local_e0,&local_b8,&local_198);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
                operator_delete((void *)local_68._0_8_);
              }
              if ((pointer *)local_138._M_allocated_capacity != local_128) {
                operator_delete((void *)local_138._M_allocated_capacity);
              }
              _Var27._M_p = (pointer)local_158._0_8_;
              if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
LAB_00186ece:
                operator_delete(_Var27._M_p);
              }
            }
            else {
              peVar4 = ((local_40._M_current)->
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              lVar26 = *(long *)&(peVar4->tokens).
                                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                                 ._M_impl.super__Vector_impl_data;
              if ((0x10 < (ulong)((long)*(pointer *)
                                         ((long)&(peVar4->tokens).
                                                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                                                 ._M_impl + 8) - lVar26)) &&
                 (token == *(Token **)(lVar26 + 0x10))) {
                if (((ulong)p_Var19[2]._M_nxt & 0xfe) == 0xe) {
                  peVar4->sid = local_e4;
                  goto LAB_00186bdb;
                }
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_b8,"only \"for\" or \"while\" can take label","");
                local_68._0_8_ = (pointer)0x0;
                local_68._8_8_ = (pointer)0x0;
                local_68._16_8_ = (pointer)0x0;
                ParserContext::errorAtToken
                          ((ParserContext *)&tokenIndex,Error,token,&local_b8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_68);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68);
                _Var27._M_p = local_b8._M_dataplus._M_p;
                first_00._M_current = local_40._M_current;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_00186ed3;
                goto LAB_00186ece;
              }
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,
                         "this line seems to be part of wrapping line, but indents may be incorrect"
                         ,"");
              local_68._0_8_ = (pointer)0x0;
              local_68._8_8_ = (pointer)0x0;
              local_68._16_8_ = (pointer)0x0;
              ParserContext::errorAtToken
                        ((ParserContext *)&tokenIndex,Error,token,&local_b8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_68);
              first_00._M_current = local_40._M_current;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              first._M_current =
                   local_178._M_current +
                   (local_118 != 0 &&
                   local_178._M_current !=
                   (node->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
            }
LAB_00186ed3:
            iVar23 = 3;
          }
LAB_00186edf:
          if (p_Var19 != (_Hash_node_base *)0x0) goto LAB_00186fd1;
        }
        first = combineWrappedLines<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                          (first,(node->blockNodes).
                                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,false);
        _Var13 = std::
                 __find_if<__gnu_cxx::__normal_iterator<chatra::NodeType_const*,std::vector<chatra::NodeType,std::allocator<chatra::NodeType>>>,__gnu_cxx::__ops::_Iter_equals_val<chatra::NodeType_const>>
                           (expressionParentType,DAT_00258460,node);
        peVar4 = ((first_00._M_current)->
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (_Var13._M_current == DAT_00258460) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"expression is not allowed here","");
          local_68._0_8_ = (pointer)0x0;
          local_68._8_8_ = (pointer)0x0;
          local_68._16_8_ = (pointer)0x0;
          peVar3 = (peVar4->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)ct.ws + 0x10))
                    (ct.ws,2,&peVar3->fileName,peVar3->lineNo,&peVar3->line,0xffffffffffffffff,
                     0xffffffffffffffff,&local_b8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          iVar23 = 3;
        }
        else {
          peVar4->type = Expression;
          iVar23 = 0;
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     *)auStack_d8,first_00._M_current);
        }
      }
      else {
        local_68._0_8_ = (pointer)(local_68 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,
                   "indent mismatch. Expected ${0} indents but ${1} indents found","");
        cVar8 = '\x01';
        if (9 < local_34) {
          uVar17 = local_34;
          cVar7 = '\x04';
          do {
            cVar8 = cVar7;
            if (uVar17 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_00186a41;
            }
            if (uVar17 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_00186a41;
            }
            if (uVar17 < 10000) goto LAB_00186a41;
            bVar28 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            cVar7 = cVar8 + '\x04';
          } while (bVar28);
          cVar8 = cVar8 + '\x01';
        }
LAB_00186a41:
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_40._M_current = first_00._M_current;
        std::__cxx11::string::_M_construct((ulong)&local_b8,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_b8._M_dataplus._M_p,(uint)local_b8._M_string_length,local_34);
        uVar17 = (((((local_40._M_current)->
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->line).
                  super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->indents;
        cVar8 = '\x01';
        if (9 < uVar17) {
          uVar18 = uVar17;
          cVar7 = '\x04';
          do {
            cVar8 = cVar7;
            if (uVar18 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_00186ad3;
            }
            if (uVar18 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_00186ad3;
            }
            if (uVar18 < 10000) goto LAB_00186ad3;
            bVar28 = 99999 < uVar18;
            uVar18 = uVar18 / 10000;
            cVar7 = cVar8 + '\x04';
          } while (bVar28);
          cVar8 = cVar8 + '\x01';
        }
LAB_00186ad3:
        local_98 = local_88;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_98,local_90,uVar17);
        __l._M_len = 2;
        __l._M_array = &local_b8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_158,__l,(allocator_type *)local_138._M_local_buf);
        ParserContext::errorAtToken
                  ((ParserContext *)&tokenIndex,Error,pTVar9,(string *)local_68,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_158);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_158);
        lVar26 = 0;
        do {
          if (local_88 + lVar26 != *(char **)((long)&local_98 + lVar26)) {
            operator_delete(*(char **)((long)&local_98 + lVar26));
          }
          lVar26 = lVar26 + -0x20;
        } while (lVar26 != -0x40);
        if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_);
        }
        psVar24 = outNodes.
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        auVar31 = auStack_d8;
        iVar23 = 2;
        auVar29 = auStack_d8;
        first._M_current = local_40._M_current;
        node = local_70;
        if ((undefined1  [8])
            outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start != auStack_d8) {
          do {
            this_00 = (((shared_ptr<chatra::Node> *)auVar29)->
                      super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                      _M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            auVar29 = (undefined1  [8])((long)auVar29 + 0x10);
          } while (auVar29 != (undefined1  [8])psVar24);
          outNodes.
          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar31;
          first._M_current = local_40._M_current;
          node = local_70;
        }
      }
LAB_00186fd1:
      first_00._M_current = first._M_current;
    } while (((iVar23 == 3) || (iVar23 == 0)) &&
            (last._M_current =
                  (node->blockNodes).
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, first_00._M_current != last._M_current
            ));
  }
  sVar14 = std::
           _Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::count((_Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)runnableContainerNodeTypes,&node->type);
  psVar24 = outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (sVar14 != 0) {
    if (auStack_d8 !=
        (undefined1  [8])
        outNodes.
        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar28 = false;
      auVar31 = auStack_d8;
      do {
        psVar16 = (shared_ptr<chatra::Node> *)((long)auVar31 + 0x10);
        sVar14 = std::
                 _Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)runnableNodeTypes,
                         &((((shared_ptr<chatra::Node> *)auVar31)->
                           super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          type);
        if (sVar14 != 0) {
          bVar28 = true;
          break;
        }
        auVar31 = (undefined1  [8])psVar16;
      } while (psVar16 != psVar24);
      if (bVar28) goto LAB_00187172;
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"empty block statement","");
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = (pointer)0x0;
    local_68._16_8_ = (pointer)0x0;
    peVar3 = (local_70->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)(*(long *)ct.ws + 0x10))
              (ct.ws,1,&peVar3->fileName,peVar3->lineNo,&peVar3->line,0xffffffffffffffff,
               0xffffffffffffffff,&local_b8,local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
LAB_00187172:
  if (auStack_d8 !=
      (undefined1  [8])
      outNodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_40._M_current = local_40._M_current & 0xffffffff00000000;
    local_34 = 0;
    bVar28 = false;
    iVar30._M_current = (shared_ptr<chatra::Node> *)auStack_d8;
    do {
      peVar4 = ((iVar30._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if ((local_34 & 1) == 0) {
        NVar2 = peVar4->type;
        cVar8 = '\0';
        if (NVar2 != Catch) {
          if (NVar2 != Finally) {
            if (!bVar28) {
              if ((byte)(NVar2 - Break) < 4) {
                bVar28 = true;
              }
              if (((ulong)local_40._M_current & 1) != 0) {
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_b8,"expected \"catch\" or \"finally\"","");
                local_68._0_8_ = (pointer)0x0;
                local_68._8_8_ = (pointer)0x0;
                local_68._16_8_ = (pointer)0x0;
                peVar3 = (peVar4->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                (**(code **)(*(long *)ct.ws + 0x10))
                          (ct.ws,2,&peVar3->fileName,peVar3->lineNo,&peVar3->line,0xffffffffffffffff
                           ,0xffffffffffffffff,&local_b8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_68);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p);
                }
                cVar8 = '\t';
                std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)auStack_d8,iVar30,
                           (iterator)
                           outNodes.
                           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_00187275;
            }
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"unreachable code","");
            local_68._0_8_ = (pointer)0x0;
            local_68._8_8_ = (pointer)0x0;
            local_68._16_8_ = (pointer)0x0;
            peVar3 = (peVar4->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            (**(code **)(*(long *)ct.ws + 0x10))
                      (ct.ws,1,&peVar3->fileName,peVar3->lineNo,&peVar3->line,0xffffffffffffffff,
                       0xffffffffffffffff,&local_b8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_68);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            lVar26 = (long)outNodes.
                           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_start - (long)iVar30._M_current >> 6;
            iVar15._M_current = iVar30._M_current;
            if (0 < lVar26) {
              iVar15._M_current =
                   (shared_ptr<chatra::Node> *)
                   ((long)&((iVar30._M_current)->
                           super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   ((long)outNodes.
                          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)iVar30._M_current &
                   0xffffffffffffffc0U));
              lVar26 = lVar26 + 1;
              __last._M_current = iVar30._M_current + 2;
              do {
                if (((__last._M_current[-2].
                      super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
                    ~ScriptRoot) == Catch) {
                  __last._M_current = __last._M_current + -2;
                  goto LAB_00187512;
                }
                if (((__last._M_current[-1].
                      super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
                    ~ScriptRoot) == Catch) {
                  __last._M_current = __last._M_current + -1;
                  goto LAB_00187512;
                }
                if (((((__last._M_current)->
                      super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
                    ~ScriptRoot) == Catch) goto LAB_00187512;
                if (((__last._M_current[1].
                      super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
                    ~ScriptRoot) == Catch) {
                  __last._M_current = __last._M_current + 1;
                  goto LAB_00187512;
                }
                lVar26 = lVar26 + -1;
                __last._M_current = __last._M_current + 4;
              } while (1 < lVar26);
            }
            lVar26 = (long)outNodes.
                           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_start - (long)iVar15._M_current >> 4;
            if (lVar26 == 1) {
LAB_00187500:
              __last._M_current =
                   outNodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (((((iVar15._M_current)->
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
                  ~ScriptRoot) == Catch) {
                __last._M_current = iVar15._M_current;
              }
            }
            else if (lVar26 == 2) {
LAB_001873f6:
              __last._M_current = iVar15._M_current;
              if (((((iVar15._M_current)->
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
                  ~ScriptRoot) != Catch) {
                iVar15._M_current = iVar15._M_current + 1;
                goto LAB_00187500;
              }
            }
            else {
              __last._M_current =
                   outNodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if ((lVar26 == 3) &&
                 (__last._M_current = iVar15._M_current,
                 ((((iVar15._M_current)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
                 ~ScriptRoot) != Catch)) {
                iVar15._M_current = iVar15._M_current + 1;
                goto LAB_001873f6;
              }
            }
LAB_00187512:
            iVar15 = std::
                     vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 *)auStack_d8,iVar30,__last);
            iVar30._M_current =
                 iVar15._M_current +
                 ((ulong)(iVar15._M_current ==
                         outNodes.
                         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) - 1);
            cVar8 = (iVar15._M_current !=
                    outNodes.
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) * '\x02' + '\t';
            goto LAB_00187275;
          }
          local_34 = 1;
        }
        local_40._M_current._0_4_ = 1;
        cVar8 = '\0';
      }
      else {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"nothing can be placed after \"finally\" block","");
        local_68._0_8_ = (pointer)0x0;
        local_68._8_8_ = (pointer)0x0;
        local_68._16_8_ = (pointer)0x0;
        peVar3 = (peVar4->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (**(code **)(*(long *)ct.ws + 0x10))
                  (ct.ws,2,&peVar3->fileName,peVar3->lineNo,&peVar3->line,0xffffffffffffffff,
                   0xffffffffffffffff,&local_b8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    *)auStack_d8,iVar30,
                   (iterator)
                   outNodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        cVar8 = '\t';
      }
LAB_00187275:
    } while (((cVar8 == '\v') || (cVar8 == '\0')) &&
            (iVar30._M_current = iVar30._M_current + 1,
            iVar30._M_current !=
            outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start));
  }
  if ((local_70->type == Switch) &&
     (auStack_d8 !=
      (undefined1  [8])
      outNodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    uVar22 = 0;
    iVar30._M_current = (shared_ptr<chatra::Node> *)auStack_d8;
    auVar31 = auStack_d8;
    do {
      psVar16 = (shared_ptr<chatra::Node> *)((long)auVar31 + 0x10);
      peVar4 = (((shared_ptr<chatra::Node> *)auVar31)->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      NVar2 = peVar4->type;
      if (NVar2 == Default) {
        bVar28 = false;
        uVar22 = CONCAT71((int7)(uVar22 >> 8),1);
      }
      else if ((NVar2 == Case) && ((uVar22 & 1) != 0)) {
        local_34 = (uint)uVar22;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"\"case\" cannot be placed after \"default\"","");
        local_68._0_8_ = (pointer)0x0;
        local_68._8_8_ = (pointer)0x0;
        local_68._16_8_ = (pointer)0x0;
        peVar3 = (peVar4->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (**(code **)(*(long *)ct.ws + 0x10))
                  (ct.ws,2,&peVar3->fileName,peVar3->lineNo,&peVar3->line,0xffffffffffffffff,
                   0xffffffffffffffff,&local_b8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        bVar28 = true;
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    *)auStack_d8,iVar30,
                   (iterator)
                   outNodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        uVar22 = (ulong)local_34;
      }
      else {
        bVar28 = false;
      }
    } while ((!bVar28) &&
            (iVar30._M_current = iVar30._M_current + 1, auVar31 = (undefined1  [8])psVar16,
            psVar16 !=
            outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start));
  }
  this = &local_70->blockNodes;
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::clear
            (this);
  psVar24 = outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_d8 !=
      (undefined1  [8])
      outNodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar31 = auStack_d8;
    do {
      pNVar5 = (((value_type *)auVar31)->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      NVar2 = pNVar5->type;
      if (NVar2 - 0xc < 2) {
        psVar6 = (local_70->blockNodes).
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (((local_70->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start == psVar6) ||
           (peVar4 = psVar6[-1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           peVar4->type != IfGroup)) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"unexpected \"else\" statement","");
          local_68._0_8_ = (pointer)0x0;
          local_68._8_8_ = (pointer)0x0;
          local_68._16_8_ = (pointer)0x0;
          peVar3 = (pNVar5->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)ct.ws + 0x10))
                    (ct.ws,2,&peVar3->fileName,peVar3->lineNo,&peVar3->line,0xffffffffffffffff,
                     0xffffffffffffffff,&local_b8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_00187856:
            operator_delete(local_b8._M_dataplus._M_p);
          }
        }
        else if (((peVar4->blockNodes).
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type == Else
                ) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"extra \"else\" statement","");
          local_68._0_8_ = (pointer)0x0;
          local_68._8_8_ = (pointer)0x0;
          local_68._16_8_ = (pointer)0x0;
          peVar3 = (pNVar5->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)ct.ws + 0x10))
                    (ct.ws,2,&peVar3->fileName,peVar3->lineNo,&peVar3->line,0xffffffffffffffff,
                     0xffffffffffffffff,&local_b8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_00187856;
        }
        else {
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back(&peVar4->blockNodes,(value_type *)auVar31);
        }
      }
      else if (NVar2 == If) {
        local_b8._M_dataplus._M_p = (pointer)0x0;
        local_b8._M_string_length = 0;
        psVar16 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                            (this,(shared_ptr<chatra::Line> *)&local_b8,IfGroup);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
        }
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::push_back(&((psVar16->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->blockNodes,(value_type *)auVar31);
        LOCK();
        (((psVar16->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        blockNodesState)._M_i = Structured;
        UNLOCK();
      }
      else {
        if ((NVar2 == Sync) && (ct.sTable._4_1_ == '\0')) {
          structureInnerNode((IErrorReceiver *)itForward._M_current,sTable,pNVar5,false);
        }
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::push_back(this,(value_type *)auVar31);
      }
      auVar31 = (undefined1  [8])((long)auVar31 + 0x10);
    } while (auVar31 != (undefined1  [8])psVar24);
  }
  pNVar5 = local_70;
  if (ct.sTable._4_1_ != '\0') {
    psVar6 = (local_70->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar24 = (local_70->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar24 != psVar6;
        psVar24 = psVar24 + 1) {
      recursiveStructureNodes
                ((IErrorReceiver *)itForward._M_current,sTable,
                 (psVar24->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
  }
  LOCK();
  (pNVar5->blockNodesState)._M_i = Structured;
  UNLOCK();
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_d8);
  return;
}

Assistant:

void structureInnerNode(IErrorReceiver& errorReceiver,
		std::shared_ptr<StringTable>& sTable, Node* node, bool recursive) {

	chatra_assert(node->blockNodes.empty() || node->blockNodesState == NodeState::Grouped);

	ParserContext ct(nullptr, errorReceiver, sTable);
	unsigned expectedIndents = (node->line ? node->line->indents + 1 : 0);

	std::vector<std::shared_ptr<Node>> outNodes;
	for (auto it = node->blockNodes.cbegin(); it != node->blockNodes.cend(); ) {
		auto& n = *it;

		if (n->line->indents != expectedIndents) {
			ct.errorAtToken(ErrorLevel::Error, n->line->tokens[0],
					"indent mismatch. Expected ${0} indents but ${1} indents found",
					{std::to_string(expectedIndents), std::to_string(n->line->indents)});
			outNodes.clear();
			break;
		}

		if (n->line->tokens[0].type == TokenType::Name) {
			// Look ahead 3 tokens to find "label : loop", "def operator" or "else if" pattern
			auto itForward = it;
			size_t tokenIndex = 0;

			auto token0 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);
			auto token1 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);
			auto token2 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);

			auto keyToken = token0;
			StringId labelName = StringId::Invalid;
			if (token2 != nullptr && !lineTypes.count(token0->sid)
					&& matches(*token1, StringId::Colon) && matches(*token2, TokenType::Name)) {
				keyToken = token2;
				labelName = token0->sid;
			}

			auto itType = lineTypes.find(keyToken->sid);
			if (itType != lineTypes.end()) {
				auto const& attr = itType->second;
				it = combineWrappedLines(it, node->blockNodes.cend(), attr.hasBlock);

				if (token2 != nullptr && labelName != StringId::Invalid) {
					if (n->tokens.size() < 3 || token2 != n->tokens[2]) {
						ct.errorAtToken(ErrorLevel::Error, *token2, "this line seems to be part of wrapping line, but indents may be incorrect", {});
						// Skip few lines which is considered as part of wrapping line
						it = (itForward == node->blockNodes.cend() || tokenIndex == 0 ? itForward : itForward + 1);
						continue;
					}
					if (attr.type != NodeType::For && attr.type != NodeType::While) {
						ct.errorAtToken(ErrorLevel::Error, *token2, R"(only "for" or "while" can take label)", {});
						continue;
					}
					n->sid = labelName;
				}

				// Check whether sentence is correctly placed
				if (std::find(attr.parentType.cbegin(), attr.parentType.cend(), node->type) == attr.parentType.cend()) {
					ct.errorAtToken(ErrorLevel::Error, *keyToken,
							std::string("statement \"") + ct.getSt()->ref(keyToken->sid) + "\" is not allowed here", {});
					continue;
				}

				n->type = attr.type;
				if (n->type == NodeType::Def && token1 != nullptr && matches(*token1, StringId::Operator))
					n->type = NodeType::DefOperator;
				if (n->type == NodeType::Else && token1 != nullptr && matches(*token1, StringId::If))
					n->type = NodeType::ElseIf;

				if (attr.hasBlock) {
					for (; it != node->blockNodes.cend() && expectedIndents < (*it)->line->indents; it++)
						n->blockNodes.push_back(*it);
				}

				outNodes.push_back(n);
				continue;
			}
		}

		it = combineWrappedLines(it, node->blockNodes.cend(), false);

		if (std::find(expressionParentType.cbegin(), expressionParentType.cend(), node->type) == expressionParentType.cend()) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "expression is not allowed here", {});
			continue;
		}

		n->type = NodeType::Expression;
		outNodes.push_back(n);
	}

	// Check empty block
	if (runnableContainerNodeTypes.count(node->type) != 0) {
		bool runnableNodeFound = false;
		for (auto& n : outNodes) {
			if (runnableNodeTypes.count(n->type) != 0) {
				runnableNodeFound = true;
				break;
			}
		}
		if (!runnableNodeFound)
			ct.errorAtLine(ErrorLevel::Warning, node->line, "empty block statement", {});
	}

	// Check order of Catch/Finally and unreachable code
	bool catchFinallyFound = false;
	bool finallyFound = false;
	bool left = false;
	for (auto it = outNodes.cbegin(); it != outNodes.cend(); it++) {
		auto& n = *it;
		if (finallyFound) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "nothing can be placed after \"finally\" block", {});
			outNodes.erase(it, outNodes.cend());
			break;
		}

		if (n->type == NodeType::Catch)
			catchFinallyFound = true;
		else if (n->type == NodeType::Finally) {
			catchFinallyFound = true;
			finallyFound = true;
		}
		else {
			if (left) {
				ct.errorAtLine(ErrorLevel::Warning, n->line, "unreachable code", {});
				it = outNodes.erase(it, std::find_if(it, outNodes.cend(), [](const std::shared_ptr<Node>& n) {
					return n->type == NodeType::Catch || n->type == NodeType::Finally; }));
				if (it == outNodes.cend())
					break;
				it--;
				continue;
			}

			switch (n->type) {
			case NodeType::Break:
			case NodeType::Continue:
			case NodeType::Return:
			case NodeType::Throw:
				left = true;
				break;
			default:
				break;
			}

			if (catchFinallyFound) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(expected "catch" or "finally")", {});
				outNodes.erase(it, outNodes.cend());
				break;
			}
		}
	}

	// Check order of Case/Default
	if (node->type == NodeType::Switch) {
		bool defaultFound = false;
		for (auto it = outNodes.cbegin(); it != outNodes.cend(); it++) {
			auto& n = *it;
			if (n->type == NodeType::Default)
				defaultFound = true;
			else if (n->type == NodeType::Case && defaultFound) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"("case" cannot be placed after "default")", {});
				outNodes.erase(it, outNodes.cend());
				break;
			}
		}
	}

	// Copy outNodes to node->blockNodes with grouping IfGroup
	node->blockNodes.clear();
	for (auto& n : outNodes) {
		switch (n->type) {
		case NodeType::Sync:
			if (!recursive)
				structureInnerNode(errorReceiver, sTable, n.get(), false);
			node->blockNodes.push_back(n);
			break;

		case NodeType::If: {
			auto& nGroup = addNode(node->blockNodes, nullptr, NodeType::IfGroup);
			nGroup->blockNodes.push_back(n);
			nGroup->blockNodesState = NodeState::Structured;
			break;
		}

		case NodeType::ElseIf:
		case NodeType::Else: {
			if (node->blockNodes.empty() || node->blockNodes.back()->type != NodeType::IfGroup) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(unexpected "else" statement)", {});
				continue;
			}
			auto& nGroup = node->blockNodes.back();
			if (nGroup->blockNodes.back()->type == NodeType::Else) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(extra "else" statement)", {});
				continue;
			}
			nGroup->blockNodes.push_back(n);
			break;
		}

		default:
			node->blockNodes.push_back(n);
			break;
		}
	}

	if (recursive) {
		for (auto& n : node->blockNodes)
			recursiveStructureNodes(errorReceiver, sTable, n.get());
	}

	node->blockNodesState = NodeState::Structured;
}